

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

void __thiscall
tcu::TextureCubeArray::TextureCubeArray
          (TextureCubeArray *this,TextureFormat *format,int size,int depth)

{
  ConstPixelBufferAccess *pCVar1;
  uint uVar2;
  
  uVar2 = 0x20;
  if (size != 0) {
    uVar2 = 0x1f;
    if (size != 0) {
      for (; (uint)size >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  TextureLevelPyramid::TextureLevelPyramid(&this->super_TextureLevelPyramid,format,0x20 - uVar2);
  this->m_size = size;
  this->m_depth = depth;
  pCVar1 = &((this->super_TextureLevelPyramid).m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess;
  (this->m_view).m_numLevels =
       (int)((ulong)((long)(this->super_TextureLevelPyramid).m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) >> 3) *
       -0x33333333;
  (this->m_view).m_levels = pCVar1;
  return;
}

Assistant:

TextureCubeArray::TextureCubeArray (const TextureFormat& format, int size, int depth)
	: TextureLevelPyramid	(format, computeMipPyramidLevels(size))
	, m_size				(size)
	, m_depth				(depth)
	, m_view				(getNumLevels(), getLevels())
{
	DE_ASSERT(m_depth % 6 == 0);
}